

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O3

void FFT(NoiseSuppressionC *self,float *time_data,size_t time_data_length,size_t magnitude_length,
        float *real,float *imag,float *magn,float *lmagn,int prev_calc,float *signalEnergy,
        float *sumMagn)

{
  long lVar1;
  size_t sVar2;
  float fVar3;
  float fVar4;
  
  if ((time_data_length >> 1) + 1 != magnitude_length) {
    __assert_fail("magnitude_length == time_data_length / 2 + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/src/ns.c"
                  ,0x611,
                  "void FFT(NoiseSuppressionC *, float *, size_t, size_t, float *, float *, float *, float *, int, float *, float *)"
                 );
  }
  WebRtc_rdft(time_data_length,1,time_data,self->ip,self->wfft);
  *imag = 0.0;
  fVar3 = *time_data;
  *real = fVar3;
  *magn = ABS(fVar3) + 1.0;
  imag[magnitude_length - 1] = 0.0;
  fVar3 = time_data[1];
  real[magnitude_length - 1] = fVar3;
  magn[magnitude_length - 1] = ABS(fVar3) + 1.0;
  if (prev_calc == 1) {
    fVar3 = *real * *real + *imag * *imag;
    fVar4 = real[magnitude_length - 1] * real[magnitude_length - 1] +
            imag[magnitude_length - 1] * imag[magnitude_length - 1];
    *signalEnergy = fVar3 + fVar4;
    *sumMagn = SQRT(fVar4) + SQRT(fVar3) + 2.0;
    fVar3 = logf(*magn);
    *lmagn = fVar3;
    fVar3 = logf(magn[magnitude_length - 1]);
    lmagn[magnitude_length - 1] = fVar3;
    if (1 < magnitude_length - 1) {
      sVar2 = 2;
      do {
        real[sVar2 - 1] = time_data[sVar2 * 2 + -2];
        fVar3 = time_data[sVar2 * 2 + -1];
        imag[sVar2 - 1] = fVar3;
        fVar3 = real[sVar2 - 1] * real[sVar2 - 1] + fVar3 * fVar3;
        *signalEnergy = fVar3 + *signalEnergy;
        fVar3 = SQRT(fVar3) + 1.0;
        magn[sVar2 - 1] = fVar3;
        *sumMagn = fVar3 + *sumMagn;
        fVar3 = logf(magn[sVar2 - 1]);
        lmagn[sVar2 - 1] = fVar3;
        sVar2 = sVar2 + 1;
      } while (magnitude_length != sVar2);
    }
  }
  else if (1 < magnitude_length - 1) {
    lVar1 = 0;
    do {
      real[lVar1 + 1] = time_data[lVar1 * 2 + 2];
      fVar3 = time_data[lVar1 * 2 + 3];
      imag[lVar1 + 1] = fVar3;
      magn[lVar1 + 1] = SQRT(real[lVar1 + 1] * real[lVar1 + 1] + fVar3 * fVar3) + 1.0;
      lVar1 = lVar1 + 1;
    } while (magnitude_length - 2 != lVar1);
  }
  return;
}

Assistant:

static void FFT(NoiseSuppressionC *self, float *time_data, size_t time_data_length, size_t magnitude_length,
                float *real, float *imag, float *magn, float *lmagn, int prev_calc, float *signalEnergy,
                float *sumMagn) {
    size_t i;

    assert(magnitude_length == time_data_length / 2 + 1);

    WebRtc_rdft(time_data_length, 1, time_data, self->ip, self->wfft);

    imag[0] = 0;
    real[0] = time_data[0];
    magn[0] = fabsf(real[0]) + 1.f;
    imag[magnitude_length - 1] = 0;
    real[magnitude_length - 1] = time_data[1];
    magn[magnitude_length - 1] = fabsf(real[magnitude_length - 1]) + 1.f;
    float *time_data_ptr = time_data + 2;
    if (prev_calc == 1) {
        float first = real[0] * real[0] + imag[0] * imag[0];
        float last = real[magnitude_length - 1] * real[magnitude_length - 1] +
                     imag[magnitude_length - 1] * imag[magnitude_length - 1];
        *signalEnergy = first + last;
        *sumMagn = sqrtf(first) + 2.f + sqrtf(last);
        lmagn[0] = logf(magn[0]);
        lmagn[magnitude_length - 1] = logf(magn[magnitude_length - 1]);
        for (i = 1; i < magnitude_length - 1; ++i) {
            real[i] = time_data_ptr[0];
            imag[i] = time_data_ptr[1];
            const float energy = real[i] * real[i] + imag[i] * imag[i];
            *signalEnergy += energy;
            // Magnitude spectrum.
            magn[i] = sqrtf(energy) + 1.f;
            *sumMagn += magn[i];
            lmagn[i] = logf(magn[i]);
            time_data_ptr += 2;
        }
    } else {
        for (i = 1; i < magnitude_length - 1; ++i) {
            real[i] = time_data_ptr[0];
            imag[i] = time_data_ptr[1];
            // Magnitude spectrum.
            magn[i] = sqrtf(real[i] * real[i] + imag[i] * imag[i]) + 1.f;
            time_data_ptr += 2;
        }
    }
}